

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void WriteVarInt<DataStream,(VarIntMode)0,unsigned_long>(DataStream *os,unsigned_long n)

{
  ulong uVar1;
  long lVar2;
  uint8_t obj;
  byte bVar3;
  ulong in_RSI;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  int len;
  uchar tmp [10];
  CheckVarIntMode<(VarIntMode)0,_unsigned_long> *in_stack_ffffffffffffffc8;
  int local_2c;
  ulong local_28;
  byte abStack_12 [17];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  CheckVarIntMode<(VarIntMode)0,_unsigned_long>::CheckVarIntMode(in_stack_ffffffffffffffc8);
  local_2c = 0;
  local_28 = in_RSI;
  while( true ) {
    bVar3 = 0;
    if (local_2c != 0) {
      bVar3 = 0x80;
    }
    abStack_12[local_2c] = (byte)local_28 & 0x7f | bVar3;
    if (local_28 < 0x80) break;
    local_28 = (local_28 >> 7) - 1;
    local_2c = local_2c + 1;
  }
  do {
    lVar2 = stack0xfffffffffffffff8;
    uVar1 = (ulong)stack0xfffffffffffffff8 >> 0x38;
    obj = (uint8_t)uVar1;
    unique0x100000bf = lVar2;
    ser_writedata8<DataStream>(in_RDI,obj);
    bVar4 = local_2c != 0;
    local_2c = local_2c + -1;
  } while (bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}